

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
* capnp::compiler::NodeTranslator::compileDecl
            (Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
             *__return_storage_ptr__,uint64_t scopeId,uint scopeParameterCount,Resolver *resolver,
            ErrorReporter *errorReporter,Reader expression,Builder brandBuilder)

{
  ImplicitParams implicitMethodParams;
  undefined1 auVar1 [40];
  Own<capnp::compiler::BrandScope,_std::nullptr_t> scope;
  NullableValue<capnp::compiler::BrandedDecl> _decl1754;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> local_1d0;
  uint local_1bc [8];
  undefined2 uStack_19a;
  undefined6 local_198;
  undefined2 uStack_192;
  undefined6 uStack_190;
  undefined1 uStack_18a;
  undefined1 uStack_189;
  undefined4 local_188;
  undefined4 uStack_184;
  uint64_t local_180;
  NullableValue<capnp::compiler::BrandedDecl> local_178;
  NullableValue<capnp::compiler::BrandedDecl> local_c8;
  
  local_1bc[0] = scopeParameterCount;
  local_180 = scopeId;
  kj::
  refcounted<capnp::compiler::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&,unsigned_int&,capnp::compiler::Resolver&>
            ((kj *)&local_1d0,errorReporter,&local_180,local_1bc,resolver);
  local_1bc[1] = 0;
  local_1bc[2] = 0;
  local_1bc[3] = 0;
  local_1bc[4] = 0;
  local_1bc[5] = 0;
  local_1bc[6] = 0;
  stack0xfffffffffffffe60 = 0;
  uStack_19a = 0;
  local_198 = 0;
  uStack_192 = 0;
  uStack_190 = 0;
  uStack_18a = 7;
  local_188 = 0x7fffffff;
  implicitMethodParams.params.reader._44_4_ = uStack_184;
  implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
  implicitMethodParams.params.reader._39_1_ = uStack_189;
  implicitMethodParams.params.reader.structDataSize = 0;
  implicitMethodParams.params.reader.structPointerCount = 0;
  implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
  auVar1 = ZEXT1640(ZEXT816(0));
  implicitMethodParams.scopeId = auVar1._0_8_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)auVar1._8_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar1._16_8_;
  implicitMethodParams.params.reader.ptr = (byte *)auVar1._24_8_;
  implicitMethodParams.params.reader.elementCount = auVar1._32_4_;
  implicitMethodParams.params.reader.step = auVar1._36_4_;
  BrandScope::compileDeclExpression
            ((Maybe<capnp::compiler::BrandedDecl> *)&local_178,local_1d0.ptr,expression,resolver,
             implicitMethodParams);
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue(&local_c8,&local_178);
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue(&local_178);
  if (local_c8.isSet == true) {
    BrandedDecl::asResolveResult
              ((ResolveResult *)&local_178,&local_c8.field_1.value,(local_1d0.ptr)->leafId,
               brandBuilder);
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::NullableValue(&__return_storage_ptr__->ptr,
                    (OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                     *)&local_178);
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue(&local_c8);
  kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose(&local_1d0);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Resolver::ResolveResult> NodeTranslator::compileDecl(
    uint64_t scopeId, uint scopeParameterCount, Resolver& resolver, ErrorReporter& errorReporter,
    Expression::Reader expression, schema::Brand::Builder brandBuilder) {
  auto scope = kj::refcounted<BrandScope>(errorReporter, scopeId, scopeParameterCount, resolver);
  KJ_IF_SOME(decl, scope->compileDeclExpression(expression, resolver, ImplicitParams::none())) {
    return decl.asResolveResult(scope->getScopeId(), brandBuilder);
  } else {
    return kj::none;
  }
}